

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::Compiler::get_block_fallback_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,VariableID id)

{
  uint32_t uVar1;
  ulong uVar2;
  SPIRType *pSVar3;
  string *psVar4;
  TypedID<(diligent_spirv_cross::Types)2> *in_R9;
  ID local_30;
  ID local_2c;
  SPIRVariable *local_28;
  SPIRVariable *var;
  Compiler *this_local;
  string *psStack_10;
  VariableID id_local;
  
  var = (SPIRVariable *)this;
  this_local._4_4_ = id.id;
  psStack_10 = __return_storage_ptr__;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  local_28 = get<diligent_spirv_cross::SPIRVariable>(this,uVar1);
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
            (&local_2c,(TypedID<(diligent_spirv_cross::Types)2> *)((long)&this_local + 4));
  get_name_abi_cxx11_(this,local_2c);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
              (&local_30,(TypedID<(diligent_spirv_cross::Types)2> *)((long)&this_local + 4));
    psVar4 = get_name_abi_cxx11_(this,local_30);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  }
  else {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_28->super_IVariant).field_0xc)
    ;
    pSVar3 = get<diligent_spirv_cross::SPIRType>(this,uVar1);
    join<char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>const&,char_const(&)[2],diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>&>
              (__return_storage_ptr__,(diligent_spirv_cross *)0xf66026,
               (char (*) [2])&(pSVar3->super_IVariant).self,
               (TypedID<(diligent_spirv_cross::Types)0> *)0xf66026,
               (char (*) [2])((long)&this_local + 4),in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Compiler::get_block_fallback_name(VariableID id) const
{
	auto &var = get<SPIRVariable>(id);
	if (get_name(id).empty())
		return join("_", get<SPIRType>(var.basetype).self, "_", id);
	else
		return get_name(id);
}